

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.c
# Opt level: O0

ufile_error bucket_request_do(CURL *curl,char *url,bucket_resp *br)

{
  int iVar1;
  cJSON *item_00;
  char *pcVar2;
  ufile_error uVar3;
  cJSON *local_888;
  cJSON *item;
  cJSON *json;
  undefined1 local_868 [8];
  char tmp [2048];
  undefined1 local_60 [8];
  http_body response_body;
  ufile_error error;
  bucket_resp *br_local;
  char *url_local;
  CURL *curl_local;
  char *local_10;
  
  response_body.pos_n = 0;
  curl_easy_setopt(curl,0x2712,url);
  curl_easy_setopt(curl,0x2734,"GET");
  if (_g_debug_open != 0) {
    curl_easy_setopt(curl,0x29,1);
  }
  curl_easy_setopt(curl,99,1);
  memset(local_60,0,0x20);
  memset(local_868,0,0x800);
  response_body.buffer = (char *)0x800;
  response_body.f = (FILE *)local_868;
  curl_easy_setopt(curl,0x4e2b,http_write_cb);
  curl_easy_setopt(curl,0x2711,local_60);
  uVar3 = curl_do(curl);
  response_body.pos_n = CONCAT44(json._4_4_,uVar3.code);
  item_00 = cJSON_Parse((char *)response_body.f);
  if (item_00 == (cJSON *)0x0) {
    response_body.pos_n = CONCAT44(response_body.pos_n._4_4_,0xfffffff6);
    local_10 = cJSON_GetErrorPtr();
    curl_local = (CURL *)response_body.pos_n;
  }
  else {
    for (local_888 = item_00->child; local_888 != (cJSON *)0x0; local_888 = local_888->next) {
      iVar1 = strcmp(local_888->string,"RetCode");
      if (iVar1 == 0) {
        br->code = local_888->valueint;
      }
      else {
        iVar1 = strcmp(local_888->string,"Message");
        if (iVar1 == 0) {
          pcVar2 = ufile_strconcat(local_888->valuestring,0);
          br->msg = pcVar2;
        }
      }
    }
    if ((_g_debug_open != 0) && (br->code != 0)) {
      printf("RetCode=%d;\nmessage=%s\n",(ulong)(uint)br->code,br->msg);
    }
    cJSON_Delete(item_00);
    uVar3 = parse_error(br);
    local_10 = uVar3.message;
    curl_local = (CURL *)(ulong)(uint)uVar3.code;
  }
  uVar3._0_8_ = (ulong)curl_local & 0xffffffff;
  uVar3.message = local_10;
  return uVar3;
}

Assistant:

static struct ufile_error
bucket_request_do(CURL *curl, const char* url, struct bucket_resp *br){
    struct ufile_error error = NO_ERROR;
    curl_easy_setopt(curl, CURLOPT_URL, url);
    curl_easy_setopt(curl, CURLOPT_CUSTOMREQUEST, "GET");
    if(_g_debug_open != 0){
        curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
    }
    curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);

    struct http_body response_body;
    memset(&response_body, 0, sizeof(response_body));
    char tmp[2048] = {0}; 
    response_body.buffer_size = 2048;
    response_body.buffer = tmp;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &response_body);

    error = curl_do(curl);
    cJSON *json = cJSON_Parse(response_body.buffer);
    if(json==NULL){
        error.code = UFILE_BUCKET_REQ_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        return error;
    }
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "RetCode") == 0){
            br->code = item->valueint;
        }else if(strcmp(item->string, "Message") == 0){
            br->msg = ufile_strconcat(item->valuestring, NULL);
        }
        item=item->next;
    }
    if(_g_debug_open != 0 && br->code !=0){
        printf("RetCode=%d;\nmessage=%s\n", br->code, br->msg);
    }

    cJSON_Delete(json);
    return parse_error(br);
}